

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

void secp256k1_context_preallocated_destroy(secp256k1_context *ctx)

{
  if (secp256k1_context_no_precomp == ctx) {
    (*(ctx->illegal_callback).fn)
              ("ctx != secp256k1_context_no_precomp",(ctx->illegal_callback).data);
  }
  else if (ctx == (secp256k1_context *)0x0) {
    return;
  }
  (ctx->ecmult_gen_ctx).built = 0;
  (ctx->ecmult_gen_ctx).blind.d[0] = 0;
  (ctx->ecmult_gen_ctx).blind.d[1] = 0;
  (ctx->ecmult_gen_ctx).blind.d[2] = 0;
  (ctx->ecmult_gen_ctx).blind.d[3] = 0;
  secp256k1_gej_clear(&(ctx->ecmult_gen_ctx).initial);
  return;
}

Assistant:

void secp256k1_context_preallocated_destroy(secp256k1_context* ctx) {
    ARG_CHECK_NO_RETURN(ctx != secp256k1_context_no_precomp);
    if (ctx != NULL) {
        secp256k1_ecmult_gen_context_clear(&ctx->ecmult_gen_ctx);
    }
}